

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

bool __thiscall Glucose::StringOption::parse(StringOption *this,char *str)

{
  bool bVar1;
  char *span;
  char *local_10;
  
  local_10 = str;
  bVar1 = match<char_const*>(&local_10,"-");
  if (((bVar1) && (bVar1 = match<char_const*>(&local_10,(this->super_Option).name), bVar1)) &&
     (bVar1 = match<char_const*>(&local_10,"="), bVar1)) {
    this->value = local_10;
    return true;
  }
  return false;
}

Assistant:

virtual bool parse(const char* str){
        const char* span = str; 

        if (!match(span, "-") || !match(span, name) || !match(span, "="))
            return false;

        value = span;
        return true;
    }